

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O2

void __thiscall QHeaderViewPrivate::QHeaderViewPrivate(QHeaderViewPrivate *this)

{
  QAbstractItemViewPrivate::QAbstractItemViewPrivate(&this->super_QAbstractItemViewPrivate);
  *(undefined ***)
   &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
    super_QWidgetPrivate = &PTR__QHeaderViewPrivate_007e5d40;
  this->state = NoState;
  this->headerOffset = 0;
  this->sortIndicatorOrder = DescendingOrder;
  this->sortIndicatorSection = 0;
  this->sortIndicatorShown = false;
  this->sortIndicatorClearable = false;
  (this->visualIndices).d.d = (Data *)0x0;
  (this->visualIndices).d.ptr = (int *)0x0;
  (this->visualIndices).d.size = 0;
  (this->logicalIndices).d.d = (Data *)0x0;
  (this->logicalIndices).d.ptr = (int *)0x0;
  (this->logicalIndices).d.size = 0;
  (this->sectionSelected).d.d.d = (Data *)0x0;
  (this->sectionSelected).d.d.ptr = (char *)0x0;
  (this->cascadingSectionSize).d = (Data *)0x0;
  (this->sectionSelected).d.d.size = 0;
  (this->hiddenSectionSize).d = (Data *)0x0;
  (this->cachedSizeHint).wd = -1;
  (this->cachedSizeHint).ht = -1;
  (this->delayedResize).m_id = Invalid;
  this->lastPos = -1;
  this->firstPos = -1;
  this->originalSize = -1;
  this->section = -1;
  this->target = -1;
  this->firstPressed = -1;
  this->pressed = -1;
  this->hover = -1;
  this->highlightSelected = false;
  this->stretchLastSection = false;
  this->cascadingResizing = false;
  this->resizeRecursionBlock = false;
  this->length = 0;
  this->preventCursorChangeInSetOffset = false;
  this->movableSections = false;
  this->clickableSections = false;
  this->highlightSelected = false;
  this->allowUserMoveOfSection0 = true;
  this->customDefaultSectionSize = false;
  this->stretchSections = 0;
  this->contentsSections = 0;
  this->oldDefaultSectionSize = -1;
  this->minimumSectionSize = -1;
  this->maximumSectionSize = -1;
  this->lastSectionSize = 0;
  this->lastSectionLogicalIdx = -1;
  this->sectionIndicatorOffset = 0;
  (this->defaultAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
  super_QFlagsStorage<Qt::AlignmentFlag>.i = 0;
  this->sectionIndicator = (QLabel *)0x0;
  this->globalResizeMode = Interactive;
  this->sectionStartposRecalc = true;
  this->resizeContentsPrecision = 1000;
  (this->sectionItems).d.d = (Data *)0x0;
  (this->sectionItems).d.ptr = (SectionItem *)0x0;
  *(undefined8 *)((long)&(this->sectionItems).d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->sectionItems).d.size + 4) = 0;
  (this->layoutChangePersistentSections).d.ptr = (LayoutChangeItem *)0x0;
  (this->layoutChangePersistentSections).d.size = 0;
  this->countInNoSectionItemsMode = 0;
  (this->layoutChangePersistentSections).d.d = (Data *)0x0;
  std::array<QMetaObject::Connection,_8UL>::array(&this->modelConnections);
  return;
}

Assistant:

QHeaderViewPrivate()
        : state(NoState),
          headerOffset(0),
          sortIndicatorOrder(Qt::DescendingOrder),
          sortIndicatorSection(0),
          sortIndicatorShown(false),
          sortIndicatorClearable(false),
          lastPos(-1),
          firstPos(-1),
          originalSize(-1),
          section(-1),
          target(-1),
          firstPressed(-1),
          pressed(-1),
          hover(-1),
          length(0),
          preventCursorChangeInSetOffset(false),
          movableSections(false),
          clickableSections(false),
          highlightSelected(false),
          stretchLastSection(false),
          cascadingResizing(false),
          resizeRecursionBlock(false),
          allowUserMoveOfSection0(true), // will be false for QTreeView and true for QTableView
          customDefaultSectionSize(false),
          stretchSections(0),
          contentsSections(0),
          minimumSectionSize(-1),
          maximumSectionSize(-1),
          lastSectionSize(0),
          lastSectionLogicalIdx(-1), // Only trust when we stretch last section
          sectionIndicatorOffset(0),
#if QT_CONFIG(label)
          sectionIndicator(nullptr),
#endif
          globalResizeMode(QHeaderView::Interactive),
          sectionStartposRecalc(true),
          resizeContentsPrecision(1000)
    {}